

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq_addon.hpp
# Opt level: O0

back_insert_iterator<std::vector<zmq::message_t,_std::allocator<zmq::message_t>_>_>
zmq::decode<std::back_insert_iterator<std::vector<zmq::message_t,std::allocator<zmq::message_t>>>>
          (message_t *encoded,
          back_insert_iterator<std::vector<zmq::message_t,_std::allocator<zmq::message_t>_>_> out)

{
  byte bVar1;
  byte bVar2;
  uint32_t uVar3;
  uchar *puVar4;
  size_t sVar5;
  out_of_range *poVar6;
  back_insert_iterator<std::vector<zmq::message_t,_std::allocator<zmq::message_t>_>_> *this;
  message_t local_88;
  ulong local_38;
  size_t part_size;
  uchar *limit;
  uchar *source;
  message_t *encoded_local;
  back_insert_iterator<std::vector<zmq::message_t,_std::allocator<zmq::message_t>_>_> out_local;
  
  source = (uchar *)encoded;
  encoded_local = (message_t *)out.container;
  puVar4 = message_t::data<unsigned_char>(encoded);
  limit = puVar4;
  sVar5 = message_t::size((message_t *)source);
  part_size = (size_t)(puVar4 + sVar5);
  while( true ) {
    if (part_size <= limit) {
      if (limit == (uchar *)part_size) {
        return (back_insert_iterator<std::vector<zmq::message_t,_std::allocator<zmq::message_t>_>_>)
               (vector<zmq::message_t,_std::allocator<zmq::message_t>_> *)encoded_local;
      }
      __assert_fail("source == limit",
                    "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/zmq_addon.hpp"
                    ,0x166,
                    "OutputIt zmq::decode(const message_t &, OutputIt) [OutputIt = std::back_insert_iterator<std::vector<zmq::message_t>>]"
                   );
    }
    bVar1 = *limit;
    local_38 = (ulong)bVar1;
    limit = limit + 1;
    bVar2 = std::numeric_limits<unsigned_char>::max();
    if ((ulong)bVar1 == (ulong)bVar2) {
      if (part_size - (long)limit < 4) {
        poVar6 = (out_of_range *)__cxa_allocate_exception(0x10);
        std::out_of_range::out_of_range(poVar6,"Malformed encoding, overflow in reading size");
        __cxa_throw(poVar6,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
      }
      uVar3 = detail::read_u32_network_order(limit);
      local_38 = (ulong)uVar3;
      limit = limit + 4;
    }
    if (part_size - (long)limit < local_38) break;
    message_t::message_t(&local_88,limit,local_38);
    this = std::back_insert_iterator<std::vector<zmq::message_t,_std::allocator<zmq::message_t>_>_>
           ::operator*((back_insert_iterator<std::vector<zmq::message_t,_std::allocator<zmq::message_t>_>_>
                        *)&encoded_local);
    std::back_insert_iterator<std::vector<zmq::message_t,_std::allocator<zmq::message_t>_>_>::
    operator=(this,&local_88);
    message_t::~message_t(&local_88);
    std::back_insert_iterator<std::vector<zmq::message_t,_std::allocator<zmq::message_t>_>_>::
    operator++((back_insert_iterator<std::vector<zmq::message_t,_std::allocator<zmq::message_t>_>_>
                *)&encoded_local);
    limit = limit + local_38;
  }
  poVar6 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(poVar6,"Malformed encoding, overflow in reading part");
  __cxa_throw(poVar6,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

OutputIt decode(const message_t &encoded, OutputIt out)
{
    const unsigned char *source = encoded.data<unsigned char>();
    const unsigned char *const limit = source + encoded.size();

    while (source < limit) {
        size_t part_size = *source++;
        if (part_size == (std::numeric_limits<std::uint8_t>::max)()) {
            if (static_cast<size_t>(limit - source) < sizeof(uint32_t)) {
                throw std::out_of_range(
                  "Malformed encoding, overflow in reading size");
            }
            part_size = detail::read_u32_network_order(source);
            // the part size is allowed to be less than 0xFF
            source += sizeof(uint32_t);
        }

        if (static_cast<size_t>(limit - source) < part_size) {
            throw std::out_of_range("Malformed encoding, overflow in reading part");
        }
        *out = message_t(source, part_size);
        ++out;
        source += part_size;
    }

    assert(source == limit);
    return out;
}